

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O0

void do_cmd_wiz_edit_player_start(command_conflict *cmd)

{
  errr eVar1;
  command *cmd_00;
  wchar_t local_14;
  wchar_t i;
  command_conflict *cmd_local;
  
  if (edit_player_state == EDIT_PLAYER_UNKNOWN) {
    edit_player_state = EDIT_PLAYER_STARTED;
    for (local_14 = L'\0'; local_14 < L'\x05'; local_14 = local_14 + L'\x01') {
      eVar1 = cmdq_push(CMD_WIZ_EDIT_PLAYER_STAT);
      if (eVar1 != 0) {
        edit_player_state = EDIT_PLAYER_BREAK;
        return;
      }
      cmd_00 = cmdq_peek();
      cmd_set_arg_choice(cmd_00,"choice",local_14);
    }
    eVar1 = cmdq_push(CMD_WIZ_EDIT_PLAYER_GOLD);
    if (eVar1 == 0) {
      eVar1 = cmdq_push(CMD_WIZ_EDIT_PLAYER_EXP);
      if (eVar1 == 0) {
        eVar1 = cmdq_push(CMD_WIZ_EDIT_PLAYER_START);
        if (eVar1 != 0) {
          edit_player_state = EDIT_PLAYER_BREAK;
        }
      }
      else {
        edit_player_state = EDIT_PLAYER_BREAK;
      }
    }
    else {
      edit_player_state = EDIT_PLAYER_BREAK;
    }
  }
  else {
    edit_player_state = EDIT_PLAYER_UNKNOWN;
  }
  return;
}

Assistant:

void do_cmd_wiz_edit_player_start(struct command *cmd)
{
	int i;

	if (edit_player_state != EDIT_PLAYER_UNKNOWN) {
		/*
		 * Invoked as the cleanup stage for an edit session to work
		 * nicely with command repetition.
		 */
		edit_player_state = EDIT_PLAYER_UNKNOWN;
		return;
	}
	edit_player_state = EDIT_PLAYER_STARTED;
	for (i = 0; i < STAT_MAX; ++i) {
		if (cmdq_push(CMD_WIZ_EDIT_PLAYER_STAT) != 0) {
			/* Failed.  Skip any queued edit commands. */
			edit_player_state = EDIT_PLAYER_BREAK;
			return;
		}
		cmd_set_arg_choice(cmdq_peek(), "choice", i);
	}
	if (cmdq_push(CMD_WIZ_EDIT_PLAYER_GOLD) != 0) {
		/* Failed.  Skip any queued edit commands. */
		edit_player_state = EDIT_PLAYER_BREAK;
		return;
	}
	if (cmdq_push(CMD_WIZ_EDIT_PLAYER_EXP) != 0) {
		/* Failed.  Skip any queued edit commands. */
		edit_player_state = EDIT_PLAYER_BREAK;
		return;
	}
	/* Make the last command look like the first so repetition works. */
	if (cmdq_push(CMD_WIZ_EDIT_PLAYER_START) != 0) {
		/* Failed. Skip any queued edit commands. */
		edit_player_state = EDIT_PLAYER_BREAK;
		return;
	}
}